

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O1

int __thiscall de::Socket::shutdown(Socket *this,int __fd,int __how)

{
  deBool dVar1;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  dVar1 = deSocket_shutdown(this->m_socket,3);
  if (dVar1 != 0) {
    return dVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Socket shutdown failed","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00151c10;
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::shutdown (void)
{
	if (!deSocket_shutdown(m_socket, DE_SOCKETCHANNEL_BOTH))
		throw SocketError("Socket shutdown failed");
}